

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

deUint32 deqp::gles3::Functional::UniformCase::randomFeatures(deUint32 seed)

{
  ShaderType SVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  Random rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  dVar2 = deRandom_getUint32(&local_40);
  dVar3 = deRandom_getUint32(&local_40);
  SVar1 = randomFeatures::uniformFuncChoices[dVar3 & 1];
  dVar3 = deRandom_getUint32(&local_40);
  dVar4 = deRandom_getUint32(&local_40);
  dVar5 = deRandom_getUint32(&local_40);
  dVar6 = deRandom_getUint32(&local_40);
  dVar7 = deRandom_getUint32(&local_40);
  return SVar1 | randomFeatures(unsigned_int)::arrayUsageChoices[dVar2 & 1] |
         randomFeatures::matrixModeChoices[dVar3 & 1] |
         randomFeatures::arrayAssignChoices[dVar4 % 3] |
         randomFeatures::uniformUsageChoices[dVar5 & 1] |
         randomFeatures::booleanApiTypeChoices[dVar6 % 3] |
         randomFeatures::uniformValueChoices[dVar7 & 1];
}

Assistant:

deUint32 UniformCase::randomFeatures (const deUint32 seed)
{
	static const deUint32 arrayUsageChoices[]		= { 0, FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX										};
	static const deUint32 uniformFuncChoices[]		= { 0, FEATURE_UNIFORMFUNC_VALUE												};
	static const deUint32 matrixModeChoices[]		= { 0, FEATURE_MATRIXMODE_ROWMAJOR												};
	static const deUint32 arrayAssignChoices[]		= { 0, FEATURE_ARRAYASSIGN_FULL,			FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	};
	static const deUint32 uniformUsageChoices[]		= { 0, FEATURE_UNIFORMUSAGE_EVERY_OTHER											};
	static const deUint32 booleanApiTypeChoices[]	= { 0, FEATURE_BOOLEANAPITYPE_INT,			FEATURE_BOOLEANAPITYPE_UINT			};
	static const deUint32 uniformValueChoices[]		= { 0, FEATURE_UNIFORMVALUE_ZERO												};

	Random rnd(seed);

	deUint32 result = 0;

#define ARRAY_CHOICE(ARR) ((ARR)[rnd.getInt(0, DE_LENGTH_OF_ARRAY(ARR)-1)])

	result |= ARRAY_CHOICE(arrayUsageChoices);
	result |= ARRAY_CHOICE(uniformFuncChoices);
	result |= ARRAY_CHOICE(matrixModeChoices);
	result |= ARRAY_CHOICE(arrayAssignChoices);
	result |= ARRAY_CHOICE(uniformUsageChoices);
	result |= ARRAY_CHOICE(booleanApiTypeChoices);
	result |= ARRAY_CHOICE(uniformValueChoices);

#undef ARRAY_CHOICE

	return result;
}